

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_reader.cpp
# Opt level: O0

bool __thiscall argo::fd_reader::read_next_block(fd_reader *this)

{
  int iVar1;
  ssize_t sVar2;
  json_io_exception *this_00;
  int *piVar3;
  int n;
  fd_reader *this_local;
  
  sVar2 = read(*(int *)&(this->super_reader).field_0x202c,(this->super_reader).m_block,0x2000);
  iVar1 = (int)sVar2;
  if (iVar1 == 0) {
    this_local._7_1_ = false;
  }
  else {
    if (iVar1 == -1) {
      this_00 = (json_io_exception *)__cxa_allocate_exception(0xd8);
      piVar3 = __errno_location();
      json_io_exception::json_io_exception(this_00,read_failed_e,*piVar3);
      __cxa_throw(this_00,&json_io_exception::typeinfo,json_io_exception::~json_io_exception);
    }
    (this->super_reader).m_block_num_bytes = iVar1;
    (this->super_reader).m_block_index = 0;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool fd_reader::read_next_block()
{
    int n = read(m_fd, m_block, block_size);

    if (n == 0)
    {
        return false;
    }
    else if (n == -1)
    {
        throw json_io_exception(json_io_exception::read_failed_e, errno);
    }
    else
    {
        m_block_num_bytes = static_cast<int>(n);
        m_block_index = 0;
        return true;
    }
}